

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

bool __thiscall
embree::SceneGraph::GroupNode::calculateClosed(GroupNode *this,bool group_instancing)

{
  bool bVar1;
  int iVar2;
  reference pRVar3;
  byte in_SIL;
  long in_RDI;
  Ref<embree::SceneGraph::Node> *c;
  iterator __end2;
  iterator __begin2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_30;
  long local_28;
  byte local_19;
  reference local_10;
  reference local_8;
  
  local_19 = in_SIL & 1;
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    *(byte *)(in_RDI + 0x58) = local_19;
    *(undefined1 *)(in_RDI + 0x59) = 0;
    local_28 = in_RDI + 0x68;
    local_30._M_current =
         (Ref<embree::SceneGraph::Node> *)
         std::
         vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::end(in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                              (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      pRVar3 = __gnu_cxx::
               __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator*(&local_30);
      local_8 = pRVar3;
      iVar2 = (*(pRVar3->ptr->super_RefCount)._vptr_RefCount[7])(pRVar3->ptr,(ulong)local_19 & 1);
      *(bool *)(in_RDI + 0x58) = (*(byte *)(in_RDI + 0x58) & 1 & (byte)iVar2 & 1) != 0;
      *(bool *)(in_RDI + 0x59) =
           (*(byte *)(in_RDI + 0x59) & 1) != 0 || (pRVar3->ptr->hasLightOrCamera & 1U) != 0;
      local_10 = pRVar3;
      __gnu_cxx::
      __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
      ::operator++(&local_30);
    }
  }
  bVar1 = false;
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    bVar1 = *(long *)(in_RDI + 0x50) == 1;
  }
  return bVar1;
}

Assistant:

bool SceneGraph::GroupNode::calculateClosed(bool group_instancing)
  {
    assert(indegree);
    if (!closed) {
      closed = group_instancing;
      hasLightOrCamera = false;
      for (auto& c : children) {
        closed &= c->calculateClosed(group_instancing);
        hasLightOrCamera |= c->hasLightOrCamera;
      }
    }
    return closed && (indegree == 1);
  }